

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O1

int __thiscall
icu_63::PluralRules::select
          (PluralRules *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  long lVar1;
  undefined4 in_register_00000034;
  ConstChar16Ptr local_20 [3];
  
  lVar1 = *(long *)(CONCAT44(in_register_00000034,__nfds) + 8);
  if (lVar1 == 0) {
    local_20[0].p_ = (char16_t *)PLURAL_DEFAULT_RULE;
    UnicodeString::UnicodeString((UnicodeString *)this,'\x01',local_20,-1);
  }
  else {
    RuleChain::select((RuleChain *)this,(int)lVar1,__readfds,__writefds,__exceptfds,__timeout);
  }
  return (int)this;
}

Assistant:

UnicodeString
PluralRules::select(const IFixedDecimal &number) const {
    if (mRules == nullptr) {
        return UnicodeString(TRUE, PLURAL_DEFAULT_RULE, -1);
    }
    else {
        return mRules->select(number);
    }
}